

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

void key_press_proc(Am_Object *command)

{
  char cVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  bool bVar4;
  Am_Input_Char c;
  Am_Object animator;
  Am_Object inter;
  Am_Input_Char local_2c;
  Am_Object local_28 [8];
  Am_Object local_20 [8];
  Am_Object local_18 [8];
  Am_Input_Char local_10;
  Am_Input_Char local_c;
  
  Am_Object::Get_Object((ushort)local_18,(ulong)command);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_18,0x11b);
  Am_Input_Char::Am_Input_Char(&local_2c,pAVar2);
  Am_Input_Char::Am_Input_Char(&local_c,"q",true);
  bVar4 = ((uint)local_c & 0xffff) != 0x103;
  if (!(bool)((bVar4 && local_2c.code == 0x103) | ~(bVar4 || local_2c.code == 0x103) & 1U)) {
    cVar1 = Am_Input_Char::helper_check_equal(SUB84(&local_2c,0));
    if (cVar1 != '\0') {
      Am_Exit_Main_Event_Loop();
      goto LAB_0010489e;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_10,"a",true);
  bVar4 = ((uint)local_10 & 0xffff) != 0x103;
  if (!(bool)((bVar4 && local_2c.code == 0x103) | ~(bVar4 || local_2c.code == 0x103) & 1U)) {
    cVar1 = Am_Input_Char::helper_check_equal(SUB84(&local_2c,0));
    if (cVar1 != '\0') {
      Am_Object::Get_Object((ushort)local_20,(ulong)local_18);
      pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_20,(ulong)ANIMATOR);
      Am_Object::Am_Object(local_28,pAVar2);
      Am_Object::~Am_Object(local_20);
      pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_28,0xcc);
      bVar4 = Am_Value::operator_cast_to_bool(pAVar2);
      Am_Object::Set((ushort)local_28,true,(ulong)!bVar4);
      Am_Object::~Am_Object(local_28);
      goto LAB_0010489e;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Keyboard Commands:",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  a - toggle animation",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  q - quit",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
LAB_0010489e:
  Am_Object::~Am_Object(local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, key_press, (Am_Object command))
{
  Am_Object inter = command.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q")
    Am_Exit_Main_Event_Loop();
  else if (c == "a") {
    Am_Object animator = inter.Get_Owner().Get(ANIMATOR);
    bool active = animator.Get(Am_ACTIVE);
    animator.Set(Am_ACTIVE, !active);
  } else
    cout << "Keyboard Commands:" << endl
         << "  a - toggle animation" << endl
         << "  q - quit" << endl;
}